

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::Mutex::Await(Mutex *this,Condition *cond)

{
  bool bVar1;
  KernelTimeout t;
  char *absl_raw_logging_internal_basename;
  Condition *cond_local;
  Mutex *this_local;
  
  bVar1 = Condition::Eval(cond);
  if (bVar1) {
    AssertReaderHeld(this);
  }
  else {
    t = synchronization_internal::KernelTimeout::Never();
    bVar1 = AwaitCommon(this,cond,t);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      raw_logging_internal::RawLog
                (kFatal,"mutex.cc",0x613,"Check %s failed: %s",
                 "this->AwaitCommon(cond, KernelTimeout::Never())",
                 "condition untrue on return from Await",cond,this,"mutex.cc");
    }
  }
  return;
}

Assistant:

void Mutex::Await(const Condition &cond) {
  if (cond.Eval()) {    // condition already true; nothing to do
    if (kDebugMode) {
      this->AssertReaderHeld();
    }
  } else {              // normal case
    ABSL_RAW_CHECK(this->AwaitCommon(cond, KernelTimeout::Never()),
                   "condition untrue on return from Await");
  }
}